

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBLookupTables.cpp
# Opt level: O0

char * GetDescriptorName(U8 descriptor)

{
  char *pcStack_10;
  U8 descriptor_local;
  
  switch(descriptor) {
  case '\x01':
    pcStack_10 = "DEVICE";
    break;
  case '\x02':
    pcStack_10 = "CONFIGURATION";
    break;
  case '\x03':
    pcStack_10 = "STRING";
    break;
  case '\x04':
    pcStack_10 = "INTERFACE";
    break;
  case '\x05':
    pcStack_10 = "ENDPOINT";
    break;
  case '\x06':
    pcStack_10 = "DEVICE_QUALIFIER";
    break;
  case '\a':
    pcStack_10 = "OTHER_SPEED_CONFIGURATION";
    break;
  case '\b':
    pcStack_10 = "INTERFACE_POWER";
    break;
  default:
    pcStack_10 = "<unknown>";
    break;
  case '!':
    pcStack_10 = "HID";
    break;
  case '\"':
    pcStack_10 = "HID Report Descriptor";
    break;
  case '#':
    pcStack_10 = "HID Physical Descriptor";
    break;
  case '$':
    pcStack_10 = "CS_INTERFACE";
    break;
  case '%':
    pcStack_10 = "CS_ENDPOINT";
  }
  return pcStack_10;
}

Assistant:

const char* GetDescriptorName( U8 descriptor )
{
    switch( descriptor )
    {
    case DT_DEVICE:
        return "DEVICE";
    case DT_CONFIGURATION:
        return "CONFIGURATION";
    case DT_STRING:
        return "STRING";
    case DT_INTERFACE:
        return "INTERFACE";
    case DT_ENDPOINT:
        return "ENDPOINT";
    case DT_DEVICE_QUALIFIER:
        return "DEVICE_QUALIFIER";
    case DT_OTHER_SPEED_CONFIGURATION:
        return "OTHER_SPEED_CONFIGURATION";
    case DT_INTERFACE_POWER:
        return "INTERFACE_POWER";

    // HID Class specific descriptors
    case DT_HID:
        return "HID";
    case DT_HID_REPORT:
        return "HID Report Descriptor";
    case DT_HID_PHYS:
        return "HID Physical Descriptor";

    // CDC Class specific descriptors
    case DT_CDC_CS_INTERFACE:
        return "CS_INTERFACE";
    case DT_CDC_CS_ENDPOINT:
        return "CS_ENDPOINT";
    }

    return "<unknown>";
}